

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomNodeListPrivate::QDomNodeListPrivate
          (QDomNodeListPrivate *this,QDomNodePrivate *n_impl,QString *name)

{
  QString *in_RDX;
  undefined8 in_RSI;
  QAtomicInt *in_RDI;
  int in_stack_ffffffffffffffdc;
  
  QAtomicInt::QAtomicInt(in_RDI,in_stack_ffffffffffffffdc);
  QString::QString((QString *)0x10db39);
  QString::QString((QString *)0x10db47);
  QList<QDomNodePrivate_*>::QList((QList<QDomNodePrivate_*> *)0x10db55);
  *(undefined8 *)(in_RDI + 2) = in_RSI;
  if (*(long *)(in_RDI + 2) != 0) {
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x10db7c);
  }
  QString::operator=((QString *)(in_RDI + 4),in_RDX);
  *(undefined8 *)(in_RDI + 0x16) = 0;
  return;
}

Assistant:

QDomNodeListPrivate::QDomNodeListPrivate(QDomNodePrivate *n_impl, const QString &name) :
    ref(1)
{
    node_impl = n_impl;
    if (node_impl)
        node_impl->ref.ref();
    tagname = name;
    timestamp = 0;
}